

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec2d.cpp
# Opt level: O1

Vec2d * __thiscall Vec2d::getOffset(Vec2d *this,Vec2d *offset)

{
  float fVar1;
  float fVar2;
  Vec2d *pVVar3;
  
  pVVar3 = (Vec2d *)operator_new(8);
  fVar1 = this->y;
  fVar2 = offset->y;
  pVVar3->x = this->x + offset->x;
  pVVar3->y = fVar1 + fVar2;
  return pVVar3;
}

Assistant:

Vec2d* Vec2d::getOffset(Vec2d* offset) {
    return new Vec2d(getX() + offset->getX(), getY() + offset->getY());
}